

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O0

void lower_mv_precision(MV *mv,int allow_hp,int is_integer)

{
  short sVar1;
  int in_EDX;
  int in_ESI;
  MV *in_RDI;
  
  if (in_EDX == 0) {
    if (in_ESI == 0) {
      if ((in_RDI->row & 1U) != 0) {
        sVar1 = 1;
        if (0 < in_RDI->row) {
          sVar1 = -1;
        }
        in_RDI->row = in_RDI->row + sVar1;
      }
      if ((in_RDI->col & 1U) != 0) {
        sVar1 = 1;
        if (0 < in_RDI->col) {
          sVar1 = -1;
        }
        in_RDI->col = in_RDI->col + sVar1;
      }
    }
  }
  else {
    integer_mv_precision(in_RDI);
  }
  return;
}

Assistant:

static inline void lower_mv_precision(MV *mv, int allow_hp, int is_integer) {
  if (is_integer) {
    integer_mv_precision(mv);
  } else {
    if (!allow_hp) {
      if (mv->row & 1) mv->row += (mv->row > 0 ? -1 : 1);
      if (mv->col & 1) mv->col += (mv->col > 0 ? -1 : 1);
    }
  }
}